

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<obs::slot<void_(int)>_>::ref(safe_list<obs::slot<void_(int)>_> *this)

{
  int iVar1;
  atomic<int> *paVar2;
  int v;
  safe_list<obs::slot<void_(int)>_> *this_local;
  
  paVar2 = &this->m_ref;
  LOCK();
  iVar1 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (-1 < iVar1) {
    return;
  }
  __assert_fail("v >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0x161,
                "void obs::safe_list<obs::slot<void (int)>>::ref() [T = obs::slot<void (int)>]");
}

Assistant:

void ref() {
#if !defined(NDEBUG)
    int v =
#endif
    m_ref.fetch_add(1);
    assert(v >= 0);
  }